

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreter::activateMethodFrame(StackInterpreter *this,CompiledMethod *newMethod)

{
  StackMemory *pSVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = *(uint *)&newMethod[1].super_ByteArray.super_ArrayedCollection.
                    super_SequenceableCollection.super_Collection.super_Object.super_ProtoObject.
                    object_header_;
  uVar7 = (ulong)(uVar5 >> 0x19 & 0xf);
  uVar5 = uVar5 >> 0x13 & 0x3f;
  uVar6 = (ulong)uVar5;
  pSVar1 = this->stack;
  puVar2 = (pSVar1->stackFrame).stackPointer;
  uVar3 = *(undefined8 *)(puVar2 + uVar7 * 8 + 8);
  (pSVar1->stackFrame).stackPointer = puVar2 + -8;
  *(uint8_t **)(puVar2 + -8) = (pSVar1->stackFrame).framePointer;
  pSVar1 = this->stack;
  puVar2 = (pSVar1->stackFrame).stackPointer;
  (pSVar1->stackFrame).framePointer = puVar2;
  (pSVar1->stackFrame).stackPointer = puVar2 + -8;
  *(CompiledMethod **)(puVar2 + -8) = newMethod;
  this->method = newMethod;
  pSVar1 = this->stack;
  puVar2 = (pSVar1->stackFrame).stackPointer;
  *(ulong *)(puVar2 + -8) = uVar7;
  (pSVar1->stackFrame).stackPointer = puVar2 + -0x10;
  *(undefined8 **)(puVar2 + -0x10) = &NilObject;
  puVar2 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar2 + -8;
  *(undefined8 *)(puVar2 + -8) = uVar3;
  if (uVar5 != 0) {
    do {
      puVar2 = (this->stack->stackFrame).stackPointer;
      (this->stack->stackFrame).stackPointer = puVar2 + -8;
      *(undefined8 **)(puVar2 + -8) = &NilObject;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  VMContext::garbageCollectionSafePoint(this->context);
  fetchFrameData(this);
  this->pc = (ulong)(*(uint *)&newMethod[1].super_ByteArray.super_ArrayedCollection.
                               super_SequenceableCollection.super_Collection.super_Object.
                               super_ProtoObject.object_header_ & 0x1fffe) * 4 + 0x10;
  checkStackOverflow(this);
  sVar4 = this->pc;
  this->pc = sVar4 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar4);
  return;
}

Assistant:

void StackInterpreter::activateMethodFrame(CompiledMethod *newMethod)
{
	// Get the method header
	auto header = *newMethod->getHeader();
	auto numArguments = header.getArgumentCount();
	auto numTemporals = header.getTemporalCount();

	// Get the receiver
	auto receiver = stackOopAtOffset((1 + numArguments)*sizeof(Oop));

	// Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(newMethod));
	this->method = newMethod;

	// Encode frame metadata
	pushUInt(encodeFrameMetaData(false, false, numArguments));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

	// Push the nil temporals.
	for(size_t i = 0; i < numTemporals; ++i)
		pushOop(Oop());

    // Safe point for GC.
    garbageCollectionSafePoint();

	// Fetch the frame data.
	fetchFrameData();

	// Set the instruction pointer.
	pc = newMethod->getFirstPCOffset();

    // Check for stack overflow.
    checkStackOverflow();

	// Fetch the first instruction opcode
	fetchNextInstructionOpcode();
}